

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom
          (Value_ImmediateValue *this,Value_ImmediateValue *from)

{
  ulong uVar1;
  LogMessage *other;
  TensorValue *pTVar2;
  ListValue *pLVar3;
  DictionaryValue *pDVar4;
  TupleValue *pTVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0x1599);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    if (this->_oneof_case_[0] != 1) {
      clear_value(this);
      this->_oneof_case_[0] = 1;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pTVar2 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue>(pAVar7);
      (this->value_).tensor_ = pTVar2;
    }
    if (from->_oneof_case_[0] == 1) {
      puVar6 = (undefined1 *)(from->value_).tensor_;
    }
    else {
      puVar6 = _TensorValue_default_instance_;
    }
    TensorValue::MergeFrom((this->value_).tensor_,(TensorValue *)puVar6);
    break;
  case 2:
    if (this->_oneof_case_[0] != 2) {
      clear_value(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pTVar5 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::TupleValue>(pAVar7);
      (this->value_).tuple_ = pTVar5;
    }
    if (from->_oneof_case_[0] == 2) {
      puVar6 = (undefined1 *)(from->value_).tuple_;
    }
    else {
      puVar6 = _TupleValue_default_instance_;
    }
    TupleValue::MergeFrom((this->value_).tuple_,(TupleValue *)puVar6);
    break;
  case 3:
    if (this->_oneof_case_[0] != 3) {
      clear_value(this);
      this->_oneof_case_[0] = 3;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pLVar3 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::ListValue>(pAVar7);
      (this->value_).list_ = pLVar3;
    }
    if (from->_oneof_case_[0] == 3) {
      puVar6 = (undefined1 *)(from->value_).list_;
    }
    else {
      puVar6 = _ListValue_default_instance_;
    }
    ListValue::MergeFrom((this->value_).list_,(ListValue *)puVar6);
    break;
  case 4:
    if (this->_oneof_case_[0] != 4) {
      clear_value(this);
      this->_oneof_case_[0] = 4;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pDVar4 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::DictionaryValue>(pAVar7);
      (this->value_).dictionary_ = pDVar4;
    }
    if (from->_oneof_case_[0] == 4) {
      puVar6 = (undefined1 *)(from->value_).dictionary_;
    }
    else {
      puVar6 = _DictionaryValue_default_instance_;
    }
    DictionaryValue::MergeFrom((this->value_).dictionary_,(DictionaryValue *)puVar6);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Value_ImmediateValue::MergeFrom(const Value_ImmediateValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kTensor: {
      _internal_mutable_tensor()->::CoreML::Specification::MILSpec::TensorValue::MergeFrom(from._internal_tensor());
      break;
    }
    case kTuple: {
      _internal_mutable_tuple()->::CoreML::Specification::MILSpec::TupleValue::MergeFrom(from._internal_tuple());
      break;
    }
    case kList: {
      _internal_mutable_list()->::CoreML::Specification::MILSpec::ListValue::MergeFrom(from._internal_list());
      break;
    }
    case kDictionary: {
      _internal_mutable_dictionary()->::CoreML::Specification::MILSpec::DictionaryValue::MergeFrom(from._internal_dictionary());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}